

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_get_fde_info_for_reg3_c
              (Dwarf_Fde_conflict fde,Dwarf_Half table_column,Dwarf_Addr pc_requested,
              Dwarf_Small *value_type,Dwarf_Unsigned *offset_relevant,Dwarf_Unsigned *register_num,
              Dwarf_Signed *offset,Dwarf_Block *block,Dwarf_Addr *row_pc_out,
              Dwarf_Bool *has_more_rows,Dwarf_Addr *subsequent_pc,Dwarf_Error *error)

{
  Dwarf_Debug dbg_00;
  ulong table_real_data_size_00;
  Dwarf_Reg_Rule_s *pDVar1;
  undefined7 uVar2;
  int iVar3;
  Dwarf_Frame_s *fde_table_00;
  Dwarf_Unsigned table_real_data_size;
  Dwarf_Debug dbg;
  int res;
  Dwarf_Frame_s *fde_table;
  Dwarf_Unsigned *register_num_local;
  Dwarf_Unsigned *offset_relevant_local;
  Dwarf_Small *value_type_local;
  Dwarf_Addr pc_requested_local;
  Dwarf_Half table_column_local;
  Dwarf_Fde_conflict fde_local;
  
  fde_table_00 = &fde->fd_fde_table;
  if (fde == (Dwarf_Fde_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5c);
    fde_local._4_4_ = 1;
  }
  else {
    dbg_00 = fde->fd_dbg;
    if ((dbg_00 == (Dwarf_Debug)0x0) || (dbg_00->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x5d,
                          "DW_DLE_FDE_DBG_NULL: An fde contains a stale Dwarf_Debug ");
      fde_local._4_4_ = 1;
    }
    else {
      if ((fde->fd_have_fde_tab == 0) || (fde->fd_fde_pc_requested != pc_requested)) {
        if (fde->fd_have_fde_tab != 0) {
          _dwarf_free_fde_table(fde_table_00);
          fde->fd_have_fde_tab = 0;
        }
        table_real_data_size_00 = dbg_00->de_frame_reg_rules_entry_count;
        iVar3 = _dwarf_initialize_fde_table(dbg_00,fde_table_00,table_real_data_size_00,error);
        if (iVar3 != 0) {
          return iVar3;
        }
        if (table_real_data_size_00 <= table_column) {
          _dwarf_free_fde_table(fde_table_00);
          fde->fd_have_fde_tab = 0;
          _dwarf_error(dbg_00,error,0x60);
          return 1;
        }
        iVar3 = _dwarf_get_fde_info_for_a_pc_row
                          (fde,pc_requested,fde_table_00,dbg_00->de_frame_cfa_col_number,
                           has_more_rows,subsequent_pc,error);
        if (iVar3 != 0) {
          _dwarf_free_fde_table(fde_table_00);
          fde->fd_have_fde_tab = 0;
          return iVar3;
        }
      }
      if (register_num != (Dwarf_Unsigned *)0x0) {
        *register_num = (fde->fd_fde_table).fr_reg[table_column].ru_register;
      }
      if (offset != (Dwarf_Signed *)0x0) {
        *offset = (fde->fd_fde_table).fr_reg[table_column].ru_offset;
      }
      if (row_pc_out != (Dwarf_Addr *)0x0) {
        *row_pc_out = fde_table_00->fr_loc;
      }
      if (block != (Dwarf_Block *)0x0) {
        pDVar1 = (fde->fd_fde_table).fr_reg;
        block->bl_len = pDVar1[table_column].ru_block.bl_len;
        block->bl_data = pDVar1[table_column].ru_block.bl_data;
        uVar2 = *(undefined7 *)&pDVar1[table_column].ru_block.field_0x11;
        block->bl_from_loclist = pDVar1[table_column].ru_block.bl_from_loclist;
        *(undefined7 *)&block->field_0x11 = uVar2;
        block->bl_section_offset = pDVar1[table_column].ru_block.bl_section_offset;
      }
      *value_type = (fde->fd_fde_table).fr_reg[table_column].ru_value_type;
      *offset_relevant = (long)(fde->fd_fde_table).fr_reg[table_column].ru_is_offset;
      fde->fd_have_fde_tab = 1;
      fde->fd_fde_pc_requested = pc_requested;
      fde_local._4_4_ = 0;
    }
  }
  return fde_local._4_4_;
}

Assistant:

int
dwarf_get_fde_info_for_reg3_c(Dwarf_Fde fde,
    Dwarf_Half      table_column,
    Dwarf_Addr      pc_requested,
    Dwarf_Small    *value_type,
    Dwarf_Unsigned *offset_relevant,
    Dwarf_Unsigned *register_num,
    Dwarf_Signed   *offset,
    Dwarf_Block    *block,
    Dwarf_Addr     *row_pc_out,
    Dwarf_Bool     *has_more_rows,
    Dwarf_Addr     *subsequent_pc,
    Dwarf_Error    *error)
{
    struct Dwarf_Frame_s * fde_table = &(fde->fd_fde_table);
    int res = DW_DLV_ERROR;

    Dwarf_Debug dbg = 0;
    Dwarf_Unsigned table_real_data_size = 0;

    FDE_NULL_CHECKS_AND_SET_DBG(fde, dbg);

    if (!fde->fd_have_fde_tab  ||
    /*  The test is just in case it's not inside the table.
        For non-MIPS
        it could be outside the table and that is just fine, it was
        really a mistake to put it in the table in 1993.  */
        fde->fd_fde_pc_requested != pc_requested) {
        if (fde->fd_have_fde_tab) {
            _dwarf_free_fde_table(fde_table);
            fde->fd_have_fde_tab = FALSE;
        }
        table_real_data_size = dbg->de_frame_reg_rules_entry_count;
        res = _dwarf_initialize_fde_table(dbg, fde_table,
            table_real_data_size, error);
        if (res != DW_DLV_OK) {
            return res;
        }
        if (table_column >= table_real_data_size) {
            _dwarf_free_fde_table(fde_table);
            fde->fd_have_fde_tab = FALSE;
            _dwarf_error(dbg, error, DW_DLE_FRAME_TABLE_COL_BAD);
            return DW_DLV_ERROR;
        }

        /*  _dwarf_get_fde_info_for_a_pc_row will perform
            more sanity checks */
        res = _dwarf_get_fde_info_for_a_pc_row(fde,
            pc_requested, fde_table,
            dbg->de_frame_cfa_col_number,
            has_more_rows,subsequent_pc,
            error);
        if (res != DW_DLV_OK) {
            _dwarf_free_fde_table(fde_table);
            fde->fd_have_fde_tab = FALSE;
            return res;
        }
    }

    if (register_num) {
        *register_num = fde_table->fr_reg[table_column].ru_register;
    }
    if (offset) {
        *offset = fde_table->fr_reg[table_column].ru_offset;
    }
    if (row_pc_out != NULL) {
        *row_pc_out = fde_table->fr_loc;
    }
    if (block) {
        *block = fde_table->fr_reg[table_column].ru_block;
    }

    /*  Without value_type the data cannot be understood,
        so we insist on it being present, we don't test it. */
    *value_type = fde_table->fr_reg[table_column].ru_value_type;
    *offset_relevant = (fde_table->fr_reg[table_column].ru_is_offset);
    fde->fd_have_fde_tab = TRUE;
    fde->fd_fde_pc_requested = pc_requested;
    return DW_DLV_OK;

}